

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::FieldGeneratorMap::FieldGeneratorMap
          (FieldGeneratorMap *this,Descriptor *descriptor,Options *options)

{
  ulong __n;
  FieldGenerator *pFVar1;
  long *plVar2;
  scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator> *psVar3;
  FieldGenerator *pFVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  this->descriptor_ = descriptor;
  this->options_ = options;
  lVar6 = (long)*(int *)(descriptor + 0x2c);
  __n = lVar6 * 8;
  uVar5 = __n + 8;
  if (0xfffffffffffffff7 < __n) {
    uVar5 = 0xffffffffffffffff;
  }
  if (lVar6 < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  plVar2 = (long *)operator_new__(uVar5);
  *plVar2 = lVar6;
  if (lVar6 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator> *)(plVar2 + 1),0,__n);
  }
  (this->field_generators_).array_ =
       (scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator> *)(plVar2 + 1);
  if (0 < *(int *)(descriptor + 0x2c)) {
    lVar7 = 0;
    lVar6 = 0;
    do {
      psVar3 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::FieldGenerator>_>
               ::operator[](&this->field_generators_,lVar6);
      pFVar4 = MakeGenerator((FieldDescriptor *)(*(long *)(descriptor + 0x30) + lVar7),options);
      pFVar1 = psVar3->ptr_;
      if (pFVar1 != pFVar4) {
        if (pFVar1 != (FieldGenerator *)0x0) {
          (*pFVar1->_vptr_FieldGenerator[1])();
        }
        psVar3->ptr_ = pFVar4;
      }
      lVar6 = lVar6 + 1;
      lVar7 = lVar7 + 0xa8;
    } while (lVar6 < *(int *)(descriptor + 0x2c));
  }
  return;
}

Assistant:

FieldGeneratorMap::FieldGeneratorMap(const Descriptor* descriptor,
                                     const Options& options)
    : descriptor_(descriptor),
      options_(options),
      field_generators_(
          new google::protobuf::scoped_ptr<FieldGenerator>[descriptor->field_count()]) {
  // Construct all the FieldGenerators.
  for (int i = 0; i < descriptor->field_count(); i++) {
    field_generators_[i].reset(MakeGenerator(descriptor->field(i), options));
  }
}